

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void google::protobuf::DescriptorPool::InternalAddGeneratedFile
               (void *encoded_file_descriptor,int size)

{
  bool bVar1;
  DescriptorPool *pDVar2;
  EncodedDescriptorDatabase *this;
  LogMessage *pLVar3;
  LogMessage local_40;
  Voidify local_2d [13];
  MutexLockMaybe local_20;
  MutexLockMaybe lock;
  int size_local;
  void *encoded_file_descriptor_local;
  
  lock.mu_._4_4_ = size;
  pDVar2 = internal_generated_pool();
  absl::lts_20250127::MutexLockMaybe::MutexLockMaybe(&local_20,pDVar2->mutex_);
  this = anon_unknown_24::GeneratedDatabase();
  bVar1 = EncodedDescriptorDatabase::Add(this,encoded_file_descriptor,lock.mu_._4_4_);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    absl::lts_20250127::MutexLockMaybe::~MutexLockMaybe(&local_20);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,0x9ce,"GeneratedDatabase()->Add(encoded_file_descriptor, size)");
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
  absl::lts_20250127::log_internal::Voidify::operator&&(local_2d,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

void DescriptorPool::InternalAddGeneratedFile(
    const void* encoded_file_descriptor, int size) {
  // So, this function is called in the process of initializing the
  // descriptors for generated proto classes.  Each generated .pb.cc file
  // has an internal procedure called AddDescriptors() which is called at
  // process startup, and that function calls this one in order to register
  // the raw bytes of the FileDescriptorProto representing the file.
  //
  // We do not actually construct the descriptor objects right away.  We just
  // hang on to the bytes until they are actually needed.  We actually construct
  // the descriptor the first time one of the following things happens:
  // * Someone calls a method like descriptor(), GetDescriptor(), or
  //   GetReflection() on the generated types, which requires returning the
  //   descriptor or an object based on it.
  // * Someone looks up the descriptor in DescriptorPool::generated_pool().
  //
  // Once one of these happens, the DescriptorPool actually parses the
  // FileDescriptorProto and generates a FileDescriptor (and all its children)
  // based on it.
  //
  // Note that FileDescriptorProto is itself a generated protocol message.
  // Therefore, when we parse one, we have to be very careful to avoid using
  // any descriptor-based operations, since this might cause infinite recursion
  // or deadlock.
  absl::MutexLockMaybe lock(internal_generated_pool()->mutex_);
  ABSL_CHECK(GeneratedDatabase()->Add(encoded_file_descriptor, size));
}